

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

Error * ot::commissioner::CommissionerImpl::DecodeActiveOperationalDataset
                  (Error *__return_storage_ptr__,ActiveOperationalDataset *aDataset,
                  ByteArray *aPayload)

{
  ErrorCode EVar1;
  Tlv *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  uint8_t *aBuf;
  pointer puVar4;
  undefined4 uVar5;
  mapped_type *pmVar6;
  ByteArray *pBVar7;
  unsigned_long aValue;
  bool bVar8;
  TlvSet tlvSet;
  allocator_type local_169;
  undefined1 local_168 [8];
  _Alloc_hider _Stack_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  undefined1 local_108 [40];
  _Alloc_hider local_e0;
  char local_d0 [16];
  Channel local_c0;
  ChannelMask local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  unsigned_short local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  uint16_t local_38;
  
  __return_storage_ptr__->mCode = kNone;
  local_110 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_110;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_140._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_140._M_impl.super__Rb_tree_header._M_header;
  local_140._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_140._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_140._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140._M_impl.super__Rb_tree_header._M_header._M_right =
       local_140._M_impl.super__Rb_tree_header._M_header._M_left;
  ActiveOperationalDataset::ActiveOperationalDataset((ActiveOperationalDataset *)local_108);
  local_38 = 0;
  tlv::GetTlvSet((Error *)local_168,(TlvSet *)&local_140,aPayload,kMeshCoP);
  __return_storage_ptr__->mCode = local_168._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&_Stack_160)
  ;
  EVar1 = __return_storage_ptr__->mCode;
  if (_Stack_160._M_p != local_158._M_local_buf + 8) {
    operator_delete(_Stack_160._M_p);
  }
  if (EVar1 == kNone) {
    local_168[0] = 0xe;
    pmVar6 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_140,local_168);
    pTVar2 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var3 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if (pTVar2 != (Tlv *)0x0) {
      pBVar7 = tlv::Tlv::GetValue(pTVar2);
      aBuf = (pBVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
      aValue = utils::Decode<unsigned_long>
                         (aBuf,(long)(pBVar7->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)aBuf);
      local_108._0_8_ = Timestamp::Decode(aValue);
      local_38 = local_38 | 0x8000;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    local_168 = (undefined1  [8])((ulong)local_168 & 0xffffffffffffff00);
    pmVar6 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_140,local_168);
    pTVar2 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var3 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if (pTVar2 != (Tlv *)0x0) {
      pBVar7 = tlv::Tlv::GetValue(pTVar2);
      puVar4 = (pBVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_c0.mPage = *puVar4;
      if (0xfffffffffffffffd <
          (ulong)((long)puVar4 -
                 (long)(pBVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish)) {
        __assert_fail("condition",
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils.hpp"
                      ,0xa2,
                      "T ot::commissioner::utils::Decode(const uint8_t *, size_t) [T = unsigned short]"
                     );
      }
      local_c0.mNumber = *(ushort *)(puVar4 + 1) << 8 | *(ushort *)(puVar4 + 1) >> 8;
      local_38 = local_38 | 0x4000;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    local_168[0] = 0x35;
    pmVar6 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_140,local_168);
    pTVar2 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var3 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    bVar8 = true;
    if (pTVar2 != (Tlv *)0x0) {
      pBVar7 = tlv::Tlv::GetValue(pTVar2);
      DecodeChannelMask((Error *)local_168,&local_b8,pBVar7);
      uVar5 = local_168._0_4_;
      if (_Stack_160._M_p != local_158._M_local_buf + 8) {
        operator_delete(_Stack_160._M_p);
      }
      bVar8 = uVar5 == kNone;
      if (bVar8) {
        local_38 = local_38 | 0x2000;
      }
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (bVar8) {
      local_168[0] = 2;
      pmVar6 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&local_140,local_168);
      pTVar2 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var3 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      if (pTVar2 != (Tlv *)0x0) {
        pBVar7 = tlv::Tlv::GetValue(pTVar2);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_108 + 8),pBVar7);
        local_38 = local_38 | 0x1000;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      local_168[0] = 7;
      pmVar6 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&local_140,local_168);
      pTVar2 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var3 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      if (pTVar2 != (Tlv *)0x0) {
        pBVar7 = tlv::Tlv::GetValue(pTVar2);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_a0,pBVar7);
        local_38 = local_38 | 0x800;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      local_168[0] = 5;
      pmVar6 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&local_140,local_168);
      pTVar2 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var3 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      if (pTVar2 != (Tlv *)0x0) {
        pBVar7 = tlv::Tlv::GetValue(pTVar2);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_88,pBVar7);
        local_38 = local_38 | 0x400;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      local_168[0] = 3;
      pmVar6 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&local_140,local_168);
      pTVar2 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var3 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      if (pTVar2 != (Tlv *)0x0) {
        tlv::Tlv::GetValueAsString_abi_cxx11_((string *)local_168,pTVar2);
        std::__cxx11::string::operator=((string *)&local_e0,(string *)local_168);
        if (local_168 != (undefined1  [8])&local_158) {
          operator_delete((void *)local_168);
        }
        local_38 = local_38 | 0x200;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      local_168[0] = 1;
      pmVar6 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&local_140,local_168);
      pTVar2 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var3 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      if (pTVar2 != (Tlv *)0x0) {
        pBVar7 = tlv::Tlv::GetValue(pTVar2);
        local_108._32_2_ = utils::Decode<unsigned_short>(pBVar7);
        local_38 = local_38 | 0x100;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      local_168[0] = 4;
      pmVar6 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&local_140,local_168);
      pTVar2 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var3 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      if (pTVar2 != (Tlv *)0x0) {
        pBVar7 = tlv::Tlv::GetValue(pTVar2);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_70,pBVar7);
        local_38 = local_38 | 0x80;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      local_168[0] = 0xc;
      pmVar6 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&local_140,local_168);
      pTVar2 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var3 = (pmVar6->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      if (pTVar2 != (Tlv *)0x0) {
        pBVar7 = tlv::Tlv::GetValue(pTVar2);
        local_58 = utils::Decode<unsigned_short>(pBVar7);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_168,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )((pBVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start + 2),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(pBVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish,&local_169);
        puVar4 = local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_168;
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)_Stack_160._M_p;
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_158._M_allocated_capacity;
        local_168 = (undefined1  [8])0x0;
        _Stack_160._M_p = (pointer)0x0;
        local_158._M_allocated_capacity = 0;
        if ((puVar4 != (pointer)0x0) && (operator_delete(puVar4), local_168 != (undefined1  [8])0x0)
           ) {
          operator_delete((void *)local_168);
        }
        local_38 = local_38 | 0x40;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      aDataset->mActiveTimestamp = (Timestamp)local_108._0_8_;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&aDataset->mExtendedPanId,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_108 + 8));
      aDataset->mPanId = local_108._32_2_;
      std::__cxx11::string::_M_assign((string *)&aDataset->mNetworkName);
      aDataset->mChannel = local_c0;
      std::
      vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ::operator=(&aDataset->mChannelMask,&local_b8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&aDataset->mMeshLocalPrefix,&local_a0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&aDataset->mNetworkMasterKey,&local_88);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&aDataset->mPSKc,&local_70);
      (aDataset->mSecurityPolicy).mRotationTime = local_58;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&(aDataset->mSecurityPolicy).mFlags,&local_50);
      aDataset->mPresentFlags = local_38;
    }
  }
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector(&local_b8);
  if (local_e0._M_p != local_d0) {
    operator_delete(local_e0._M_p);
  }
  if ((pointer)local_108._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._8_8_);
  }
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&local_140);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::DecodeActiveOperationalDataset(ActiveOperationalDataset &aDataset, const ByteArray &aPayload)
{
    Error                    error;
    tlv::TlvSet              tlvSet;
    ActiveOperationalDataset dataset;

    // Clear all data fields
    dataset.mPresentFlags = 0;

    SuccessOrExit(error = tlv::GetTlvSet(tlvSet, aPayload));

    if (auto activeTimeStamp = tlvSet[tlv::Type::kActiveTimestamp])
    {
        uint64_t value;
        value                    = utils::Decode<uint64_t>(activeTimeStamp->GetValue());
        dataset.mActiveTimestamp = Timestamp::Decode(value);
        dataset.mPresentFlags |= ActiveOperationalDataset::kActiveTimestampBit;
    }

    if (auto channel = tlvSet[tlv::Type::kChannel])
    {
        const ByteArray &value   = channel->GetValue();
        dataset.mChannel.mPage   = value[0];
        dataset.mChannel.mNumber = utils::Decode<uint16_t>(value.data() + 1, value.size() - 1);
        dataset.mPresentFlags |= ActiveOperationalDataset::kChannelBit;
    }

    if (auto channelMask = tlvSet[tlv::Type::kChannelMask])
    {
        SuccessOrExit(DecodeChannelMask(dataset.mChannelMask, channelMask->GetValue()));
        dataset.mPresentFlags |= ActiveOperationalDataset::kChannelMaskBit;
    }

    if (auto extendedPanId = tlvSet[tlv::Type::kExtendedPanId])
    {
        dataset.mExtendedPanId = extendedPanId->GetValue();
        dataset.mPresentFlags |= ActiveOperationalDataset::kExtendedPanIdBit;
    }

    if (auto meshLocalPrefix = tlvSet[tlv::Type::kNetworkMeshLocalPrefix])
    {
        dataset.mMeshLocalPrefix = meshLocalPrefix->GetValue();
        dataset.mPresentFlags |= ActiveOperationalDataset::kMeshLocalPrefixBit;
    }

    if (auto networkMasterKey = tlvSet[tlv::Type::kNetworkMasterKey])
    {
        dataset.mNetworkMasterKey = networkMasterKey->GetValue();
        dataset.mPresentFlags |= ActiveOperationalDataset::kNetworkMasterKeyBit;
    }

    if (auto networkName = tlvSet[tlv::Type::kNetworkName])
    {
        dataset.mNetworkName = networkName->GetValueAsString();
        dataset.mPresentFlags |= ActiveOperationalDataset::kNetworkNameBit;
    }

    if (auto panId = tlvSet[tlv::Type::kPanId])
    {
        dataset.mPanId = utils::Decode<uint16_t>(panId->GetValue());
        dataset.mPresentFlags |= ActiveOperationalDataset::kPanIdBit;
    }

    if (auto pskc = tlvSet[tlv::Type::kPSKc])
    {
        dataset.mPSKc = pskc->GetValue();
        dataset.mPresentFlags |= ActiveOperationalDataset::kPSKcBit;
    }

    if (auto securityPolicy = tlvSet[tlv::Type::kSecurityPolicy])
    {
        auto &value                           = securityPolicy->GetValue();
        dataset.mSecurityPolicy.mRotationTime = utils::Decode<uint16_t>(value);
        dataset.mSecurityPolicy.mFlags        = {value.begin() + sizeof(uint16_t), value.end()};
        dataset.mPresentFlags |= ActiveOperationalDataset::kSecurityPolicyBit;
    }

    aDataset = dataset;

exit:
    return error;
}